

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_waiter.c
# Opt level: O0

void nsync::do_once(nsync_atomic_uint32_ *ponce,_func_void_void_ptr *dest)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint local_1c;
  uint32_t o;
  _func_void_void_ptr *dest_local;
  nsync_atomic_uint32_ *ponce_local;
  
  local_1c = std::atomic_load_explicit<unsigned_int>(ponce,memory_order_acquire);
  if (local_1c != 2) {
    while( true ) {
      bVar3 = false;
      if (local_1c == 0) {
        iVar1 = atm_cas_acq_u32_(ponce,0,1);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      local_1c = std::atomic_load_explicit<unsigned_int>(ponce,memory_order_relaxed);
    }
    if (local_1c == 0) {
      pthread_key_create(&waiter_key,(__destr_function *)dest);
      std::atomic_store_explicit<unsigned_int>(ponce,2,memory_order_release);
    }
    while (uVar2 = std::atomic_load_explicit<unsigned_int>(ponce,memory_order_acquire), uVar2 != 2)
    {
      sched_yield();
    }
  }
  return;
}

Assistant:

static void do_once (nsync_atomic_uint32_ *ponce, void (*dest) (void *)) {
	uint32_t o = ATM_LOAD_ACQ (ponce);
	if (o != 2) {
		while (o == 0 && !ATM_CAS_ACQ (ponce, 0, 1)) {
			o = ATM_LOAD (ponce);
		}
		if (o == 0) {
			pthread_key_create (&waiter_key, dest);
			ATM_STORE_REL (ponce, 2);
		}
		while (ATM_LOAD_ACQ (ponce) != 2) {
			sched_yield ();
		}
	}
}